

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector.cpp
# Opt level: O2

Vector * Intersection(Vector *Va,Vector *Vb)

{
  int iVar1;
  int iVar2;
  Vector *V;
  ElementType x;
  uint uVar3;
  
  V = (Vector *)malloc(0x10);
  iVar1 = Vb->VectorLength;
  iVar2 = Va->VectorLength;
  if (iVar1 < Va->VectorLength) {
    iVar2 = iVar1;
  }
  InitVector(V,iVar2);
  uVar3 = 0;
  do {
    do {
      if (iVar1 <= (int)uVar3) {
        return V;
      }
      x = 0;
      if ((int)uVar3 < Vb->VectorLength) {
        x = Vb->elements[uVar3];
      }
      iVar2 = Find(Va,x);
    } while (iVar2 == -1);
    Insert(V,x,0);
    uVar3 = uVar3 + 1;
  } while( true );
}

Assistant:

Vector *Intersection(Vector *Va,Vector *Vb)  //向量交集
{  //求Va和Vb中的相同元素，并存入Vc
    int m,n,i,j,k;
    ElementType x;
    Vector *Vc = (Vector *)malloc(sizeof(Vector));
    n = Va->VectorLength;
    m = Vb->VectorLength;
    InitVector(Vc,(m>n)?n:m);  //取较小的向量大小作为向量交集的初始化大小
    i = 0;
    j = 0;
    while(i<m)
    {
        x = GetNode(Vb,i);  //从Vb中取一结点
        k = Find(Va,x);  //在Va中查找等值结点
        if(k != -1)  //若找到等值结点
        {
            Insert(Vc, x, j);
            i++;
        }
    }
    return Vc;
}